

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  anon_class_8_1_e519008b_for__M_pred __pred;
  Command *this;
  const_iterator pvVar3;
  Command *__str;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  char *pcVar5;
  long in_RSI;
  int in_EDI;
  bool isPiped;
  __string_type args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  iterator __end1;
  iterator __begin1;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  stringstream joinedArgs;
  Command *command;
  string cmdString;
  string argFile;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  undefined6 in_stack_fffffffffffffc08;
  char in_stack_fffffffffffffc0e;
  char in_stack_fffffffffffffc0f;
  Command *in_stack_fffffffffffffc10;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc18;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc20;
  Command *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc50;
  undefined1 local_2d0 [104];
  stringstream local_268 [48];
  _Quoted_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_stack_fffffffffffffdc8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffdd0;
  allocator<char> local_89 [40];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_61;
  undefined1 local_60 [92];
  int local_4;
  
  local_4 = 0;
  __pred.cmdString = (string *)(in_RSI + 8);
  this = (Command *)(in_RSI + (long)in_EDI * 8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x106acb);
  std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::deque<char**,void>
            ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc40,(char **)this,(char **)__pred.cmdString,
             (allocator_type *)in_stack_fffffffffffffc28);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_61);
  bVar1 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x106b04);
  if (bVar1) {
    helpAndExit();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc40,(char *)this,(allocator<char> *)__pred.cmdString);
  std::allocator<char>::~allocator(local_89);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front(in_stack_fffffffffffffc20);
  bVar1 = std::operator==(&in_stack_fffffffffffffc10->cmd_id_,
                          (char *)CONCAT17(in_stack_fffffffffffffc0f,
                                           CONCAT16(in_stack_fffffffffffffc0e,
                                                    in_stack_fffffffffffffc08)));
  if (bVar1) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc10);
    popFirst(in_stack_fffffffffffffc18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffc40,&this->cmd_id_);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc10->cmd_id_);
  }
  popFirst(in_stack_fffffffffffffc18);
  pvVar3 = std::array<Command,_7UL>::begin((array<Command,_7UL> *)0x106bcc);
  std::array<Command,_7UL>::end((array<Command,_7UL> *)0x106bdd);
  __str = std::find_if<Command_const*,main::__0>(in_stack_fffffffffffffc28,pvVar3,__pred);
  pvVar3 = std::array<Command,_7UL>::end((array<Command,_7UL> *)0x106c23);
  if (__str != pvVar3) {
    std::__cxx11::stringstream::stringstream(local_268);
    local_2d0._96_8_ = local_60;
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffc0f,
                        CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)));
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT17(in_stack_fffffffffffffc0f,
                      CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)));
    while (bVar1 = std::operator==((_Self *)(local_2d0 + 0x40),(_Self *)(local_2d0 + 0x20)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
      ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                   *)(local_2d0 + 0x40));
      in_stack_fffffffffffffc10 = (Command *)local_2d0;
      std::__cxx11::string::string(__pred.cmdString,&__str->cmd_id_);
      std::quoted<char,std::char_traits<char>,std::allocator<char>>
                (&in_stack_fffffffffffffc10->cmd_id_,in_stack_fffffffffffffc0f,
                 in_stack_fffffffffffffc0e);
      pbVar4 = std::__detail::operator<<(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      std::operator<<((ostream *)pbVar4," ");
      std::__cxx11::string::~string(&in_stack_fffffffffffffc10->cmd_id_);
      std::
      _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
      ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                    *)in_stack_fffffffffffffc10);
    }
    std::__cxx11::stringstream::str();
    iVar2 = fileno(_stdout);
    iVar2 = isatty(iVar2);
    if ((iVar2 == 0) && (pcVar5 = getenv("SKIP_PIPE_FILTERING"), pcVar5 == (char *)0x0)) {
      local_4 = Command::runWithoutDefaultArgs(this,__pred.cmdString);
    }
    else {
      Command::Command(in_stack_fffffffffffffc10,
                       (Command *)
                       CONCAT17(in_stack_fffffffffffffc0f,
                                CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)));
      std::__cxx11::string::string(__pred.cmdString,&__str->cmd_id_);
      std::__cxx11::string::string(__pred.cmdString,&__str->cmd_id_);
      local_4 = runAndWriteFile((Command *)__end1._M_first,__end1._M_cur,(string *)arg.field_2._8_8_
                               );
      std::__cxx11::string::~string(&in_stack_fffffffffffffc10->cmd_id_);
      std::__cxx11::string::~string(&in_stack_fffffffffffffc10->cmd_id_);
      Command::~Command(in_stack_fffffffffffffc10);
    }
    std::__cxx11::string::~string(&in_stack_fffffffffffffc10->cmd_id_);
    std::__cxx11::stringstream::~stringstream(local_268);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc10->cmd_id_);
    std::__cxx11::string::~string(&in_stack_fffffffffffffc10->cmd_id_);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque(in_stack_fffffffffffffc50);
    return local_4;
  }
  helpAndExit();
}

Assistant:

int main(int argc, char *argv[]) {
  std::deque<std::string> arguments(argv + 1, argv + argc);
  if (arguments.empty())
    helpAndExit();

  std::string argFile("/tmp/tag_aliases");
  if (arguments.front() == "--alias-file") {
    arguments.pop_front();
    argFile = popFirst(arguments);
  }

  let cmdString = popFirst(arguments);
  let *command =
      std::find_if(COMMANDS.begin(), COMMANDS.end(), [&cmdString](auto &cmd) {
        return cmdString == cmd.cmd_id();
      });

  if (command == COMMANDS.end())
    helpAndExit();

  std::stringstream joinedArgs;
  for (auto arg : arguments) {
    joinedArgs << std::quoted(arg) << " ";
  }

  let args = joinedArgs.str();
  let isPiped = !isatty(fileno(stdout));
  if (isPiped && std::getenv("SKIP_PIPE_FILTERING") == nullptr)
    return command->runWithoutDefaultArgs(args);

  return runAndWriteFile(*command, argFile, args);
}